

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3843::ComputeInternalForces
          (ChElementHexaANCF_3843 *this,ChVectorDynamic<> *Fi)

{
  if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows != 0x60)
  {
    __assert_fail("Fi.size() == 3 * NSF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementHexaANCF_3843.cpp"
                  ,0x1d2,
                  "virtual void chrono::fea::ChElementHexaANCF_3843::ComputeInternalForces(ChVectorDynamic<> &)"
                 );
  }
  if (this->m_method == ContInt) {
    if (this->m_damping_enabled != true) {
      ComputeInternalForcesContIntNoDamping(this,Fi);
      return;
    }
    ComputeInternalForcesContIntDamping(this,Fi);
    return;
  }
  ComputeInternalForcesContIntPreInt(this,Fi);
  return;
}

Assistant:

void ChElementHexaANCF_3843::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    assert(Fi.size() == 3 * NSF);

    if (m_method == IntFrcMethod::ContInt) {
        if (m_damping_enabled) {  // If linear Kelvin-Voigt viscoelastic material model is enabled
            ComputeInternalForcesContIntDamping(Fi);
        } else {
            ComputeInternalForcesContIntNoDamping(Fi);
        }
    } else {
        ComputeInternalForcesContIntPreInt(Fi);
    }
}